

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6acc::TENSOR_SWAP_AXIS_Test::~TENSOR_SWAP_AXIS_Test(TENSOR_SWAP_AXIS_Test *this)

{
  TENSOR_SWAP_AXIS_Test *this_local;
  
  ~TENSOR_SWAP_AXIS_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(TENSOR, SWAP_AXIS) {
        try {
            tensor<int, 3> ts({
                                      {
                                              {1, 2, 3, 4},
                                              {5, 6, 7, 8},
                                              {9, 10, 11, 12}
                                      },
                                      {
                                              {1, 2, 3, 4},
                                              {5, 6, 7, 8},
                                              {9, 10, 11, 12}
                                      }
                              }, {2, 3, 4});
            EXPECT_EQ((ts[{1, 1, 2}]), 7);
            ts.swap_axis(1, 2);
            EXPECT_EQ((ts[{1, 2, 1}]), 7);
            ts.swap_axis(0, 1);
            EXPECT_EQ((ts[{2, 1, 1}]), 7);
            EXPECT_EQ((ts[{3, 0, 1}]), 8);
        }
        catch (const dnet::misc::exception &e) {
            std::cout << e << std::endl;
        }
    }